

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_functions.hpp
# Opt level: O0

void test_angular_quadrature<IntegratorXX::AhrensBeylkin<double>>
               (string *msg,AhrensBeylkin<double> *quad,int maxL,double e)

{
  string local_140;
  string local_120;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> loc_msg;
  int m;
  int l;
  double e_local;
  int maxL_local;
  AhrensBeylkin<double> *quad_local;
  string *msg_local;
  
  for (loc_msg.field_2._12_4_ = 1; (int)loc_msg.field_2._12_4_ < maxL;
      loc_msg.field_2._12_4_ = loc_msg.field_2._12_4_ + 1) {
    for (loc_msg.field_2._8_4_ = 0; (int)loc_msg.field_2._8_4_ <= (int)loc_msg.field_2._12_4_;
        loc_msg.field_2._8_4_ = loc_msg.field_2._8_4_ + 1) {
      std::operator+(&local_d0,msg,"(L,M) = (");
      std::__cxx11::to_string(&local_f0,loc_msg.field_2._12_4_);
      std::operator+(&local_b0,&local_d0,&local_f0);
      std::operator+(&local_90,&local_b0,",");
      std::__cxx11::to_string(&local_120,loc_msg.field_2._8_4_);
      std::operator+(&local_70,&local_90,&local_120);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     &local_70,")");
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::string((string *)&local_140,(string *)local_50);
      test_quadrature<MagnitudeSquaredSphericalHarmonic,IntegratorXX::AhrensBeylkin<double>,int&,int&>
                (&local_140,quad,1.0,e,(int *)(loc_msg.field_2._M_local_buf + 0xc),
                 (int *)(loc_msg.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  return;
}

Assistant:

void test_angular_quadrature(std::string msg, const QuadType& quad, int maxL, double e) {

  for( auto l = 1; l < maxL; ++l )
  for( auto m = 0; m <= l; ++m ) {
    auto loc_msg = msg + "(L,M) = (" + std::to_string(l) + "," + std::to_string(m) + ")";
    test_quadrature<MagnitudeSquaredSphericalHarmonic>(loc_msg, quad, 1.0, e, l, m); 
  }

}